

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing_sse2.c
# Opt level: O1

void MultRow_SSE2(uint8_t *ptr,uint8_t *alpha,int width,int inverse)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  unkuint9 Var24;
  undefined1 auVar25 [11];
  undefined1 auVar26 [15];
  unkuint9 Var27;
  undefined1 auVar28 [11];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [16];
  int width_00;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  undefined1 auVar37 [16];
  
  auVar33 = _DAT_00127450;
  uVar35 = 0;
  if (7 < width && inverse == 0) {
    uVar34 = 0;
    do {
      uVar35 = *(ulong *)(ptr + uVar34);
      uVar36 = *(ulong *)(alpha + uVar34);
      auVar9._8_6_ = 0;
      auVar9._0_8_ = uVar35;
      auVar9[0xe] = (char)(uVar35 >> 0x38);
      auVar11._8_4_ = 0;
      auVar11._0_8_ = uVar35;
      auVar11[0xc] = (char)(uVar35 >> 0x30);
      auVar11._13_2_ = auVar9._13_2_;
      auVar13._8_4_ = 0;
      auVar13._0_8_ = uVar35;
      auVar13._12_3_ = auVar11._12_3_;
      auVar15._8_2_ = 0;
      auVar15._0_8_ = uVar35;
      auVar15[10] = (char)(uVar35 >> 0x28);
      auVar15._11_4_ = auVar13._11_4_;
      auVar17._8_2_ = 0;
      auVar17._0_8_ = uVar35;
      auVar17._10_5_ = auVar15._10_5_;
      auVar19[8] = (char)(uVar35 >> 0x20);
      auVar19._0_8_ = uVar35;
      auVar19._9_6_ = auVar17._9_6_;
      auVar23._7_8_ = 0;
      auVar23._0_7_ = auVar19._8_7_;
      Var24 = CONCAT81(SUB158(auVar23 << 0x40,7),(char)(uVar35 >> 0x18));
      auVar29._9_6_ = 0;
      auVar29._0_9_ = Var24;
      auVar25._1_10_ = SUB1510(auVar29 << 0x30,5);
      auVar25[0] = (char)(uVar35 >> 0x10);
      auVar30._11_4_ = 0;
      auVar30._0_11_ = auVar25;
      auVar21[2] = (char)(uVar35 >> 8);
      auVar21._0_2_ = (ushort)uVar35;
      auVar21._3_12_ = SUB1512(auVar30 << 0x20,3);
      auVar10._8_6_ = 0;
      auVar10._0_8_ = uVar36;
      auVar10[0xe] = (char)(uVar36 >> 0x38);
      auVar12._8_4_ = 0;
      auVar12._0_8_ = uVar36;
      auVar12[0xc] = (char)(uVar36 >> 0x30);
      auVar12._13_2_ = auVar10._13_2_;
      auVar14._8_4_ = 0;
      auVar14._0_8_ = uVar36;
      auVar14._12_3_ = auVar12._12_3_;
      auVar16._8_2_ = 0;
      auVar16._0_8_ = uVar36;
      auVar16[10] = (char)(uVar36 >> 0x28);
      auVar16._11_4_ = auVar14._11_4_;
      auVar18._8_2_ = 0;
      auVar18._0_8_ = uVar36;
      auVar18._10_5_ = auVar16._10_5_;
      auVar20[8] = (char)(uVar36 >> 0x20);
      auVar20._0_8_ = uVar36;
      auVar20._9_6_ = auVar18._9_6_;
      auVar26._7_8_ = 0;
      auVar26._0_7_ = auVar20._8_7_;
      Var27 = CONCAT81(SUB158(auVar26 << 0x40,7),(char)(uVar36 >> 0x18));
      auVar31._9_6_ = 0;
      auVar31._0_9_ = Var27;
      auVar28._1_10_ = SUB1510(auVar31 << 0x30,5);
      auVar28[0] = (char)(uVar36 >> 0x10);
      auVar32._11_4_ = 0;
      auVar32._0_11_ = auVar28;
      auVar22[2] = (char)(uVar36 >> 8);
      auVar22._0_2_ = (ushort)uVar36;
      auVar22._3_12_ = SUB1512(auVar32 << 0x20,3);
      auVar37._0_2_ = ((ushort)uVar36 & 0xff) * ((ushort)uVar35 & 0xff) + 0x80;
      auVar37._2_2_ = auVar22._2_2_ * auVar21._2_2_ + 0x80;
      auVar37._4_2_ = auVar28._0_2_ * auVar25._0_2_ + 0x80;
      auVar37._6_2_ = (short)Var27 * (short)Var24 + 0x80;
      auVar37._8_2_ = auVar20._8_2_ * auVar19._8_2_ + 0x80;
      auVar37._10_2_ = auVar16._10_2_ * auVar15._10_2_ + 0x80;
      auVar37._12_2_ = auVar12._12_2_ * auVar11._12_2_ + 0x80;
      auVar37._14_2_ = (auVar10._13_2_ >> 8) * (auVar9._13_2_ >> 8) + 0x80;
      auVar37 = pmulhuw(auVar37,auVar33);
      sVar1 = auVar37._0_2_;
      sVar2 = auVar37._2_2_;
      sVar3 = auVar37._4_2_;
      sVar4 = auVar37._6_2_;
      sVar5 = auVar37._8_2_;
      sVar6 = auVar37._10_2_;
      sVar7 = auVar37._12_2_;
      sVar8 = auVar37._14_2_;
      *(ulong *)(ptr + uVar34) =
           CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar37[0xe] - (0xff < sVar8),
                    CONCAT16((0 < sVar7) * (sVar7 < 0x100) * auVar37[0xc] - (0xff < sVar7),
                             CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar37[10] - (0xff < sVar6),
                                      CONCAT14((0 < sVar5) * (sVar5 < 0x100) * auVar37[8] -
                                               (0xff < sVar5),
                                               CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar37[6] -
                                                        (0xff < sVar4),
                                                        CONCAT12((0 < sVar3) * (sVar3 < 0x100) *
                                                                 auVar37[4] - (0xff < sVar3),
                                                                 CONCAT11((0 < sVar2) *
                                                                          (sVar2 < 0x100) *
                                                                          auVar37[2] -
                                                                          (0xff < sVar2),
                                                                          (0 < sVar1) *
                                                                          (sVar1 < 0x100) *
                                                                          auVar37[0] -
                                                                          (0xff < sVar1))))))));
      uVar35 = uVar34 + 8;
      uVar36 = uVar34 + 0x10;
      uVar34 = uVar35;
    } while (uVar36 <= (uint)width);
  }
  width_00 = width - (int)uVar35;
  if (width_00 != 0 && (int)uVar35 <= width) {
    WebPMultRow_C(ptr + (uVar35 & 0xffffffff),alpha + (uVar35 & 0xffffffff),width_00,inverse);
    return;
  }
  return;
}

Assistant:

static void MultRow_SSE2(uint8_t* WEBP_RESTRICT const ptr,
                         const uint8_t* WEBP_RESTRICT const alpha,
                         int width, int inverse) {
  int x = 0;
  if (!inverse) {
    const __m128i zero = _mm_setzero_si128();
    const __m128i k128 = _mm_set1_epi16(128);
    const __m128i kMult = _mm_set1_epi16(0x0101);
    for (x = 0; x + 8 <= width; x += 8) {
      const __m128i v0 = _mm_loadl_epi64((__m128i*)&ptr[x]);
      const __m128i a0 = _mm_loadl_epi64((const __m128i*)&alpha[x]);
      const __m128i v1 = _mm_unpacklo_epi8(v0, zero);
      const __m128i a1 = _mm_unpacklo_epi8(a0, zero);
      const __m128i v2 = _mm_mullo_epi16(v1, a1);
      const __m128i v3 = _mm_add_epi16(v2, k128);
      const __m128i v4 = _mm_mulhi_epu16(v3, kMult);
      const __m128i v5 = _mm_packus_epi16(v4, zero);
      _mm_storel_epi64((__m128i*)&ptr[x], v5);
    }
  }
  width -= x;
  if (width > 0) WebPMultRow_C(ptr + x, alpha + x, width, inverse);
}